

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNodeSetDupNs(xmlNodePtr node,xmlNsPtr ns)

{
  xmlChar *pxVar1;
  _xmlNode *p_Var2;
  xmlNsPtr cur;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if ((ns == (xmlNsPtr)0x0) || (ns->type != XML_NAMESPACE_DECL)) {
    node_local = (xmlNodePtr)0x0;
  }
  else {
    node_local = (xmlNodePtr)ns;
    if ((node != (xmlNodePtr)0x0) && (node->type != XML_NAMESPACE_DECL)) {
      node_local = (xmlNodePtr)(*xmlMalloc)(0x30);
      if (node_local == (xmlNodePtr)0x0) {
        node_local = (xmlNodePtr)0x0;
      }
      else {
        memset(node_local,0,0x30);
        node_local->type = XML_NAMESPACE_DECL;
        if (ns->href != (xmlChar *)0x0) {
          pxVar1 = xmlStrdup(ns->href);
          node_local->name = pxVar1;
          if (node_local->name == (xmlChar *)0x0) {
            (*xmlFree)(node_local);
            return (xmlNodePtr)0x0;
          }
        }
        if (ns->prefix != (xmlChar *)0x0) {
          p_Var2 = (_xmlNode *)xmlStrdup(ns->prefix);
          node_local->children = p_Var2;
          if (node_local->children == (_xmlNode *)0x0) {
            (*xmlFree)(node_local->name);
            (*xmlFree)(node_local);
            return (xmlNodePtr)0x0;
          }
        }
        node_local->_private = node;
      }
    }
  }
  return node_local;
}

Assistant:

static xmlNodePtr
xmlXPathNodeSetDupNs(xmlNodePtr node, xmlNsPtr ns) {
    xmlNsPtr cur;

    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL))
	return(NULL);
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
	return((xmlNodePtr) ns);

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_NAMESPACE_DECL;
    if (ns->href != NULL) {
	cur->href = xmlStrdup(ns->href);
        if (cur->href == NULL) {
            xmlFree(cur);
            return(NULL);
        }
    }
    if (ns->prefix != NULL) {
	cur->prefix = xmlStrdup(ns->prefix);
        if (cur->prefix == NULL) {
            xmlFree((xmlChar *) cur->href);
            xmlFree(cur);
            return(NULL);
        }
    }
    cur->next = (xmlNsPtr) node;
    return((xmlNodePtr) cur);
}